

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O2

void printIssues(LoggerPtr *l,bool headings,bool cellmlElementTypes,bool rule)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  ulong uVar4;
  ostream *poVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  string local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [3];
  long local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000009,rule);
  local_60 = (undefined4)CONCAT71(in_register_00000011,cellmlElementTypes);
  local_5c = (undefined4)CONCAT71(in_register_00000031,headings);
  uVar3 = libcellml::Logger::errorCount();
  auVar8._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar8._0_8_ = uVar3;
  auVar8._12_4_ = 0x45300000;
  dVar7 = log10((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
  dVar7 = floor(dVar7);
  local_38 = (long)(int)dVar7;
  lVar6 = 1;
  while( true ) {
    uVar4 = libcellml::Logger::issueCount();
    if (uVar4 <= lVar6 - 1U) break;
    libcellml::Logger::issue((ulong)local_58);
    uVar1 = libcellml::Issue::level();
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
    if (uVar1 < 3) {
      poVar5 = std::operator<<((ostream *)&std::cout,
                               &DAT_0010da84 + *(int *)(&DAT_0010da84 + (ulong)uVar1 * 4));
      *(long *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x10) = local_38;
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,": ");
    }
    if ((char)local_5c != '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      libcellml::Logger::issue((ulong)local_78);
      libcellml::Issue::referenceHeading_abi_cxx11_();
      std::operator<<(poVar5,local_58);
      std::__cxx11::string::~string(local_58);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    }
    if ((char)local_60 != '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      libcellml::Logger::issue((ulong)local_78);
      libcellml::Issue::item();
      iVar2 = libcellml::AnyCellmlElement::type();
      std::ostream::operator<<(poVar5,iVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    }
    if ((char)local_64 != '\0') {
      poVar5 = std::operator<<((ostream *)&std::cout,", ");
      libcellml::Logger::issue((ulong)local_58);
      iVar2 = libcellml::Issue::referenceRule();
      std::ostream::operator<<(poVar5,iVar2);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
    }
    poVar5 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    libcellml::Logger::issue((ulong)local_78);
    libcellml::Issue::description_abi_cxx11_();
    poVar5 = std::operator<<(poVar5,local_58);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string(local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
    lVar6 = lVar6 + 1;
  }
  return;
}

Assistant:

void printIssues(const libcellml::LoggerPtr &l, bool headings, bool cellmlElementTypes, bool rule)
{
    int width = int(floor(log10(l->errorCount())));
    for (size_t i = 0; i < l->issueCount(); ++i) {
        switch (l->issue(i)->level()) {
        case libcellml::Issue::Level::ERROR:
            std::cout << "Error " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::WARNING:
            std::cout << "Warning " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::MESSAGE:
            std::cout << "Message " << std::setw(width) << i + 1 << ": ";
            break;
        default:
            break;
        }

        if (headings) {
            std::cout << ", " << l->issue(i)->referenceHeading();
        }
        if (cellmlElementTypes) {
            std::cout << ", " << static_cast<int>(l->issue(i)->item()->type());
        }
        if (rule) {
            std::cout << ", " << static_cast<int>(l->issue(i)->referenceRule());
        }
        std::cout << std::endl
                  << l->issue(i)->description() << std::endl;
    }
}